

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stream.cpp
# Opt level: O1

LogStream * __thiscall cppnet::LogStream::operator<<(LogStream *this,int64_t v)

{
  uint32_t *puVar1;
  uint uVar2;
  element_type *peVar3;
  int iVar4;
  
  peVar3 = (this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    uVar2 = peVar3->_len;
    if ((ulong)uVar2 < 0x400) {
      iVar4 = snprintf(peVar3->_log + uVar2,(ulong)(0x400 - uVar2),"%ld",v);
      puVar1 = &((this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _len;
      *puVar1 = *puVar1 + iVar4;
    }
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(int64_t v) {
    CHECK_CONTINUE()
#ifdef __win__
    _log->_len += snprintf(_log->_log + _log->_len, __log_block_size - _log->_len, "%I64d", v);
#else
    _log->_len += snprintf(_log->_log + _log->_len, __log_block_size - _log->_len, "%ld", v);
#endif
    return *this;
}